

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_generators.cpp
# Opt level: O0

Vector3d * opengv::generateRandomPointPlane(void)

{
  double dVar1;
  int iVar2;
  Scalar *pSVar3;
  Vector3d *in_RDI;
  undefined1 auVar4 [16];
  Vector3d *cleanPoint;
  double index;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *in_stack_ffffffffffffffc0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this;
  
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0xad474b);
  iVar2 = rand();
  index = ((double)iVar2 / 2147483647.0 - 0.5) * 2.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (in_stack_ffffffffffffffc0,(Index)index);
  *pSVar3 = index;
  iVar2 = rand();
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
         (((double)iVar2 / 2147483647.0 - 0.5) * 2.0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  *pSVar3 = (Scalar)this;
  iVar2 = rand();
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  *pSVar3 = ((double)iVar2 / 2147483647.0 - 0.5) * 2.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  *pSVar3 = dVar1 * 6.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  *pSVar3 = dVar1 * 6.0;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *pSVar3;
  auVar4 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar4,ZEXT816(0xc018000000000000));
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     (this,(Index)index);
  *pSVar3 = auVar4._0_8_;
  return in_RDI;
}

Assistant:

Eigen::Vector3d
opengv::generateRandomPointPlane()
{
  Eigen::Vector3d cleanPoint;
  cleanPoint[0] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[1] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;
  cleanPoint[2] = (((double) rand())/ ((double) RAND_MAX)-0.5)*2.0;

  cleanPoint[0] = 6*cleanPoint[0];
  cleanPoint[1] = 6*cleanPoint[1];
  cleanPoint[2] = 2*cleanPoint[2]-6.0;

  return cleanPoint;
}